

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillEBCellFlag
          (Level *this,FabArray<amrex::EBCellFlagFab> *cellflag,Geometry *geom)

{
  bool bVar1;
  IndexType IVar2;
  FabType t;
  FabArrayBase *in_RSI;
  Level *in_RDI;
  Periodicity PVar3;
  Box result;
  Box *b;
  int nshrink;
  FabType typ;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box *ibox;
  pair<int,_amrex::Box> *is;
  iterator __end5;
  iterator __begin5;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range5;
  IntVect *iv;
  const_iterator __end4;
  const_iterator __begin4;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range4;
  Box *bx;
  Array4<amrex::EBCellFlag> *a;
  EBCellFlagFab *fab_1;
  MFIter mfi_1;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  EBCellFlag cov_val;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  int ng;
  EBCellFlagFab *fab;
  MFIter mfi;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffad0;
  FabArray<amrex::EBCellFlagFab> *this_00;
  MFItInfo *in_stack_fffffffffffffae0;
  MFItInfo *in_stack_fffffffffffffaf0;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffaf8;
  Geometry *in_stack_fffffffffffffb00;
  MFIter *this_01;
  FabArrayBase *bx_00;
  undefined4 in_stack_fffffffffffffb10;
  IndexType IVar4;
  FabArray<amrex::EBCellFlagFab> *pFVar5;
  int dest_comp;
  int in_stack_fffffffffffffb2c;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffb30;
  int local_4bc [3];
  int dst_nghost;
  int in_stack_fffffffffffffb58;
  IndexType in_stack_fffffffffffffb5c;
  CpOp in_stack_fffffffffffffb60;
  int local_494;
  int local_48c;
  int local_488;
  int local_484;
  int local_444;
  int local_440;
  int iStack_43c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_438;
  pair<int,_amrex::Box> *local_418;
  iterator in_stack_fffffffffffffbf0;
  EBCellFlagFab *in_stack_fffffffffffffbf8;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_3d0;
  _Rb_tree_node_base *local_3c8;
  Box *local_3c0;
  Array4<amrex::EBCellFlag> local_3b8;
  Array4<amrex::EBCellFlag> *local_378;
  EBCellFlagFab *local_370;
  undefined1 local_364 [116];
  undefined1 local_2f0 [56];
  int local_2b8;
  IndexType local_2ac;
  int iStack_2a8;
  int local_2a4;
  _Rb_tree_node_base local_2a0;
  IntVect local_280;
  undefined1 local_270 [124];
  uint32_t local_1f4;
  FabArrayBase *local_1e8;
  _Tuple_impl<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
  local_1c8;
  RefID local_1a0;
  EBCellFlag local_188;
  int local_184;
  int local_180;
  int local_17c;
  DataAllocator local_178;
  EBCellFlag local_16c;
  EBCellFlagFab *local_168;
  int local_15c;
  Box *local_158;
  undefined4 local_14c;
  MultiArray4<amrex::EBCellFlag> local_148;
  undefined4 local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  undefined4 local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  undefined4 local_11c;
  FBData<amrex::EBCellFlagFab> *local_118;
  undefined4 local_10c;
  unique_ptr<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
  local_108;
  undefined4 local_fc;
  unique_ptr<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
  local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  dst_nghost = SUB84(stack0xfffffffffffffb4c,4);
  local_1e8 = in_RSI;
  bVar1 = isAllRegular(in_RDI);
  if (bVar1) {
    EBCellFlag::EBCellFlag(&local_16c,0xffffffe4);
    flags_ = (uchar)((ulong)in_stack_fffffffffffffaf0 >> 0x38);
    local_1f4 = local_16c.flag;
    FabArray<amrex::EBCellFlagFab>::setVal<amrex::EBCellFlagFab,_0>
              ((FabArray<amrex::EBCellFlagFab> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (value_type)(uint32_t)((ulong)in_stack_fffffffffffffad0 >> 0x20));
    MFIter::MFIter((MFIter *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,flags_);
    while (bVar1 = MFIter::isValid((MFIter *)(local_270 + 0x18)), bVar1) {
      local_270._16_8_ =
           FabArray<amrex::EBCellFlagFab>::operator[]
                     (in_stack_fffffffffffffad0,
                      (MFIter *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      EBCellFlagFab::setType((EBCellFlagFab *)local_270._16_8_,regular);
      MFIter::operator++((MFIter *)(local_270 + 0x18));
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffad0);
  }
  else {
    dest_comp = 0;
    IVar2.itype = FabArrayBase::nGrow(local_1e8,0);
    pFVar5 = &in_RDI->m_cellflag;
    local_270._12_4_ = IVar2.itype;
    PVar3 = Geometry::periodicity(in_stack_fffffffffffffb00);
    local_280.vect[2] = PVar3.period.vect[2];
    local_270._8_4_ = local_280.vect[2];
    local_280.vect._0_8_ = PVar3.period.vect._0_8_;
    local_270._0_4_ = local_280.vect[0];
    local_270._4_4_ = local_280.vect[1];
    this_00 = (FabArray<amrex::EBCellFlagFab> *)local_270;
    IVar4.itype = IVar2.itype;
    local_280 = PVar3.period.vect;
    FabArray<amrex::EBCellFlagFab>::ParallelCopy
              ((FabArray<amrex::EBCellFlagFab> *)in_RDI,in_stack_fffffffffffffb30,
               in_stack_fffffffffffffb2c,dest_comp,(int)((ulong)pFVar5 >> 0x20),(int)pFVar5,
               dst_nghost,
               (Periodicity *)CONCAT44(in_stack_fffffffffffffb5c.itype,in_stack_fffffffffffffb58),
               in_stack_fffffffffffffb60);
    PVar3 = Geometry::periodicity(in_stack_fffffffffffffb00);
    local_2f0._48_8_ = PVar3.period.vect._0_8_;
    local_2ac.itype = local_2f0._48_4_;
    iStack_2a8 = local_2f0._52_4_;
    local_2b8 = PVar3.period.vect[2];
    local_2a4 = local_2b8;
    unique0x10000a81 = PVar3;
    Periodicity::shiftIntVect((Periodicity *)CONCAT44(in_stack_fffffffffffffb2c,dest_comp));
    local_2a0._M_right = &local_2a0;
    EBCellFlag::EBCellFlag(&local_188,0x40003);
    local_2f0._44_4_ = local_188.flag;
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x149864d);
    this_01 = (MFIter *)local_364;
    MFItInfo::MFItInfo(in_stack_fffffffffffffae0);
    MFItInfo::UseDefaultStream((MFItInfo *)this_01);
    MFIter::MFIter(this_01,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    bx_00 = local_1e8;
    while (bVar1 = MFIter::isValid((MFIter *)(local_364 + 0x14)), bVar1) {
      local_370 = FabArray<amrex::EBCellFlagFab>::operator[]
                            (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype));
      local_a8 = (local_370->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_b0 = &(local_370->super_BaseFab<amrex::EBCellFlag>).domain;
      local_b4 = (local_370->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_5c = 0;
      local_88 = (local_b0->smallend).vect[0];
      local_6c = 1;
      iStack_84 = (local_370->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_d0.x = (local_b0->smallend).vect[0];
      local_d0.y = (local_b0->smallend).vect[1];
      local_7c = 2;
      local_d0.z = (local_370->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_8 = &(local_370->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_c = 0;
      local_38 = local_8->vect[0] + 1;
      local_18 = &(local_370->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_1c = 1;
      iStack_34 = (local_370->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      local_28 = &(local_370->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_2c = 2;
      local_f0.z = (local_370->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      local_168 = local_370;
      local_dc._0_8_ = local_f0._0_8_;
      local_dc.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      Array4<amrex::EBCellFlag>::Array4(&local_3b8,local_a8,&local_c0,&local_dc,local_b4);
      local_378 = &local_3b8;
      local_3c0 = BaseFab<amrex::EBCellFlag>::box(&local_370->super_BaseFab<amrex::EBCellFlag>);
      bVar1 = BoxArray::empty((BoxArray *)0x14989ac);
      if (!bVar1) {
        local_3c8 = local_2a0._M_right;
        local_3d0._M_current =
             (IntVect *)
             std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                       ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT44(in_stack_fffffffffffffacc,IVar2.itype));
        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                  ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                   CONCAT44(in_stack_fffffffffffffacc,IVar2.itype));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                   *)this_00,
                                  (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype)), bVar1) {
          __gnu_cxx::
          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator*(&local_3d0);
          Box::operator+((Box *)this_00,(IntVect *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype));
          BoxArray::intersections
                    ((BoxArray *)CONCAT44(IVar4.itype,in_stack_fffffffffffffb10),(Box *)bx_00,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)this_01);
          in_stack_fffffffffffffbf8 = (EBCellFlagFab *)local_2f0;
          in_stack_fffffffffffffbf0 =
               std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               ::begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype));
          local_418 = (pair<int,_amrex::Box> *)
                      std::
                      vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ::end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                             *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                     *)this_00,
                                    (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype)), bVar1) {
            bStack_438.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                 ::operator*((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                              *)&stack0xfffffffffffffbf0);
            Box::operator-((Box *)this_00,(IntVect *)CONCAT44(in_stack_fffffffffffffacc,IVar2.itype)
                          );
            local_fc = 0;
            local_10c = 1;
            local_11c = 2;
            local_128 = &bStack_438;
            local_12c = 0;
            local_138 = &bStack_438;
            local_13c = 1;
            local_148.hp = (Array4<amrex::EBCellFlag> *)&bStack_438;
            local_14c = 2;
            for (local_484 = iStack_43c; local_488 = local_440,
                local_484 <= (int)bStack_438._M_string_length; local_484 = local_484 + 1) {
              for (; local_48c = local_444, local_488 <= (int)bStack_438._4_4_;
                  local_488 = local_488 + 1) {
                for (; local_48c <= (int)bStack_438._0_4_; local_48c = local_48c + 1) {
                  local_178.m_arena = (Arena *)local_378;
                  local_17c = local_48c;
                  local_180 = local_488;
                  local_184 = local_484;
                  local_378->p
                  [(long)(local_48c - (local_378->begin).x) +
                   (long)(local_488 - (local_378->begin).y) * local_378->jstride +
                   (long)(local_484 - (local_378->begin).z) * local_378->kstride].flag =
                       local_2f0._44_4_;
                }
              }
            }
            bStack_438.field_2._M_allocated_capacity =
                 (size_type)(FBData<amrex::EBCellFlagFab> *)&local_444;
            local_1c8.super__Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false>.
            _M_head_impl = (_Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false>)
                           (_Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false>)&local_444
            ;
            local_1a0.data = (BARef *)&local_444;
            local_118 = (FBData<amrex::EBCellFlagFab> *)&local_444;
            local_108._M_t.
            super___uniq_ptr_impl<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
            .super__Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>,_true,_true>
                  )(__uniq_ptr_data<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>,_true,_true>
                    )&local_444;
            local_f8._M_t.
            super___uniq_ptr_impl<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabArray<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
            .super__Head_base<0UL,_amrex::FabArray<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>,_true,_true>
                  )(__uniq_ptr_data<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>,_true,_true>
                    )&local_444;
            __gnu_cxx::
            __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
            ::operator++((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                          *)&stack0xfffffffffffffbf0);
          }
          __gnu_cxx::
          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator++(&local_3d0);
        }
      }
      EBCellFlagFab::setType(local_370,undefined);
      t = EBCellFlagFab::getType
                    (in_stack_fffffffffffffbf8,(Box *)in_stack_fffffffffffffbf0._M_current);
      EBCellFlagFab::setType(local_370,t);
      for (local_494 = 1; local_494 < (int)local_270._12_4_; local_494 = local_494 + 1) {
        local_15c = -local_494;
        local_158 = local_3c0;
        local_4bc._0_8_ = *(undefined8 *)(local_3c0->smallend).vect;
        Box::grow((Box *)local_4bc,local_15c);
        EBCellFlagFab::getType
                  (in_stack_fffffffffffffbf8,(Box *)in_stack_fffffffffffffbf0._M_current);
      }
      MFIter::operator++((MFIter *)(local_364 + 0x14));
    }
    MFIter::~MFIter((MFIter *)this_00);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffae0);
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffae0)
    ;
  }
  return;
}

Assistant:

void
Level::fillEBCellFlag (FabArray<EBCellFlagFab>& cellflag, const Geometry& geom) const
{
    if (isAllRegular()) {
        cellflag.setVal(EBCellFlag::TheDefaultCell());
        for (MFIter mfi(cellflag); mfi.isValid(); ++mfi)
        {
            auto& fab = cellflag[mfi];
            fab.setType(FabType::regular);
        }
        return;
    }

    const int ng = cellflag.nGrow();

    cellflag.ParallelCopy(m_cellflag,0,0,1,0,ng,geom.periodicity());

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    auto cov_val = EBCellFlag::TheCoveredCell();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(cellflag,MFItInfo().UseDefaultStream()); mfi.isValid(); ++mfi)
        {
            auto& fab = cellflag[mfi];
            auto const& a = fab.array();
            const Box& bx = fab.box();
            if (!m_covered_grids.empty())
            {
                for (const auto& iv : pshifts)
                {
                    m_covered_grids.intersections(bx+iv, isects);
                    for (const auto& is : isects) {
                        Box const& ibox = is.second-iv;
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(ibox, i, j, k,
                        {
                            a(i,j,k) = cov_val;
                        });
                    }
                }
            }

            // fix type for each fab
            fab.setType(FabType::undefined);
            auto typ = fab.getType(bx);
            fab.setType(typ);
            for (int nshrink = 1; nshrink < ng; ++nshrink) {
                const Box& b = amrex::grow(bx,-nshrink);
                fab.getType(b);
            }
        }
    }
}